

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O2

void rhash_sha3_final(sha3_ctx *ctx,uchar *result)

{
  byte *pbVar1;
  uint uVar2;
  long lVar3;
  ulong block_size;
  uint uVar4;
  
  uVar2 = ctx->block_size;
  block_size = (ulong)uVar2;
  uVar4 = 100 - (uVar2 >> 1);
  lVar3 = (long)(int)ctx->rest;
  if (-1 < lVar3) {
    memset((void *)((long)ctx->message + lVar3),0,block_size - lVar3);
    pbVar1 = (byte *)((long)ctx->message + (ulong)ctx->rest);
    *pbVar1 = *pbVar1 | 6;
    pbVar1 = (byte *)((long)ctx->message + (block_size - 1));
    *pbVar1 = *pbVar1 | 0x80;
    rhash_sha3_process_block(ctx->hash,ctx->message,block_size);
    ctx->rest = 0x80000000;
  }
  if (uVar4 < uVar2) {
    if (result != (uchar *)0x0) {
      memcpy(result,ctx,(ulong)uVar4);
      return;
    }
    return;
  }
  __assert_fail("block_size > digest_length",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibrhash/librhash/sha3.c"
                ,0x145,"void rhash_sha3_final(sha3_ctx *, unsigned char *)");
}

Assistant:

void rhash_sha3_final(sha3_ctx *ctx, unsigned char* result)
{
	size_t digest_length = 100 - ctx->block_size / 2;
	const size_t block_size = ctx->block_size;

	if (!(ctx->rest & SHA3_FINALIZED))
	{
		/* clear the rest of the data queue */
		memset((char*)ctx->message + ctx->rest, 0, block_size - ctx->rest);
		((char*)ctx->message)[ctx->rest] |= 0x06;
		((char*)ctx->message)[block_size - 1] |= 0x80;

		/* process final block */
		rhash_sha3_process_block(ctx->hash, ctx->message, block_size);
		ctx->rest = SHA3_FINALIZED; /* mark context as finalized */
	}

	assert(block_size > digest_length);
	if (result) me64_to_le_str(result, ctx->hash, digest_length);
}